

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_prepend_func(uo_cb *cb,uo_cb_func cb_func)

{
  uo_linklist *puVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  long in_FS_OFFSET;
  
  uo_cb_func_linkpool_grow(0x20);
  puVar1 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
  puVar2 = puVar1->next;
  puVar2->prev = puVar1->prev;
  puVar1->prev->next = puVar2;
  puVar1->next = (uo_linklist *)0x0;
  puVar1->prev = (uo_linklist *)0x0;
  puVar1[1].next = (uo_linklist *)cb_func;
  puVar2 = (cb->funclist).next;
  puVar3 = puVar2->prev;
  puVar1->prev = puVar3;
  puVar3->next = puVar1;
  puVar1->next = puVar2;
  puVar2->prev = puVar1;
  return;
}

Assistant:

void uo_cb_prepend_func(
    uo_cb *cb,
    uo_cb_func cb_func)
{
    uo_cb_func_linklist *cb_func_linklist = uo_cb_func_linkpool_rent();
    cb_func_linklist->item = cb_func;
    uo_linklist_link(cb->funclist.next, cb_func_linklist);
}